

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O3

QFbWindow * __thiscall QFbScreen::windowForId(QFbScreen *this,WId wid)

{
  WId WVar1;
  ulong uVar2;
  
  if (*(long *)(this + 0x30) != 0) {
    uVar2 = 0;
    do {
      WVar1 = (**(code **)(**(long **)(*(long *)(this + 0x28) + uVar2 * 8) + 0x68))();
      if (WVar1 == wid) {
        return *(QFbWindow **)(*(long *)(this + 0x28) + uVar2 * 8);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < *(ulong *)(this + 0x30));
  }
  return (QFbWindow *)0x0;
}

Assistant:

QFbWindow *QFbScreen::windowForId(WId wid) const
{
    for (int i = 0; i < mWindowStack.size(); ++i) {
        if (mWindowStack[i]->winId() == wid)
            return mWindowStack[i];
    }
    return nullptr;
}